

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

void __thiscall QRegularExpressionMatch::QRegularExpressionMatch(QRegularExpressionMatch *this)

{
  QRegularExpressionMatchPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  QRegularExpression local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRegularExpressionMatchPrivate *)operator_new(0x60);
  QRegularExpression::QRegularExpression(&local_30);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  QRegularExpressionMatchPrivate::QRegularExpressionMatchPrivate
            (this_00,&local_30,(QString *)&local_48,(QStringView)ZEXT816(0),NoMatch,
             (MatchOptions)0x0);
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QRegularExpression::~QRegularExpression(&local_30);
  ((this->d).d.ptr)->isValid = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatch::QRegularExpressionMatch()
    : d(new QRegularExpressionMatchPrivate(QRegularExpression(),
                                           QString(),
                                           QStringView(),
                                           QRegularExpression::NoMatch,
                                           QRegularExpression::NoMatchOption))
{
    d->isValid = true;
}